

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

void __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
::Dump(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
       *this,FILE *stream,ui32_t depth)

{
  pointer this_00;
  char identbuf [128];
  char acStack_a8 [128];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  for (this_00 = (this->
                 super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                 ).
                 super__Vector_base<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      (this->
      super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
      ).
      super__Vector_base<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    IndexTableSegment::DeltaEntry::EncodeString(this_00,acStack_a8,0x80);
    fprintf((FILE *)stream,"  %s\n",acStack_a8);
  }
  return;
}

Assistant:

void Dump(FILE* stream = 0, ui32_t depth = 0) {
	    (void) depth;
	    char identbuf[IdentBufferLen];

	    if ( stream == 0 )
	      {
		stream = stderr;
	      }
	    
	    typename ContainerType::const_iterator i;
	    for ( i = this->begin(); i != this->end(); ++i )
	      {
		fprintf(stream, "  %s\n", (*i).EncodeString(identbuf, IdentBufferLen));
	      }
	  }